

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O1

qint64 __thiscall QFSFileEnginePrivate::nativeRead(QFSFileEnginePrivate *this,char *data,qint64 len)

{
  QFSFileEnginePrivate *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  qint64 qVar8;
  
  if (this->fh != (FILE *)0x0) {
    this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEnginePrivate).q_ptr;
    bVar2 = isSequentialFdFh(this);
    if (bVar2) {
      iVar3 = fileno((FILE *)this->fh);
      uVar4 = fcntl(iVar3,3);
      iVar3 = 0;
      qVar8 = 0;
      do {
        if ((uVar4 >> 0xb & 1) == 0) {
          iVar5 = fileno((FILE *)this->fh);
          fcntl(iVar5,4,(ulong)(uVar4 | 0x800));
        }
        do {
          sVar6 = fread(data + qVar8,1,len - qVar8,(FILE *)this->fh);
          if (sVar6 != 0) {
            qVar8 = qVar8 + sVar6;
            bVar2 = true;
            goto LAB_00173e50;
          }
          iVar5 = feof((FILE *)this->fh);
        } while ((iVar5 == 0) && (piVar7 = __errno_location(), *piVar7 == 4));
        bVar2 = qVar8 != 0;
        if (((uVar4 >> 0xb & 1) == 0) && (qVar8 == 0)) {
          iVar5 = fileno((FILE *)this->fh);
          fcntl(iVar5,4,(ulong)uVar4);
          do {
            iVar5 = fgetc((FILE *)this->fh);
            if (iVar5 != -1) {
              *data = (char)iVar5;
              bVar2 = false;
              qVar8 = 1;
              goto LAB_00173ecd;
            }
            piVar7 = __errno_location();
          } while (*piVar7 == 4);
          bVar2 = true;
          qVar8 = 0;
LAB_00173ecd:
          if (iVar5 != -1) {
            bVar2 = false;
          }
        }
LAB_00173e50:
        bVar1 = iVar3 != 0;
        iVar3 = iVar3 + 1;
        if (bVar2 || bVar1) {
          if ((uVar4 >> 0xb & 1) == 0) {
            iVar3 = fileno((FILE *)this->fh);
            fcntl(iVar3,4,(ulong)uVar4);
          }
          if ((qVar8 == 0) && (iVar3 = feof((FILE *)this->fh), iVar3 == 0)) {
            nativeRead(this_00);
            qVar8 = -1;
          }
          return qVar8;
        }
      } while( true );
    }
  }
  qVar8 = readFdFh(this,data,len);
  return qVar8;
}

Assistant:

qint64 QFSFileEnginePrivate::nativeRead(char *data, qint64 len)
{
    Q_Q(QFSFileEngine);

    if (fh && nativeIsSequential()) {
        size_t readBytes = 0;
        int oldFlags = fcntl(QT_FILENO(fh), F_GETFL);
        for (int i = 0; i < 2; ++i) {
            // Unix: Make the underlying file descriptor non-blocking
            if ((oldFlags & O_NONBLOCK) == 0)
                fcntl(QT_FILENO(fh), F_SETFL, oldFlags | O_NONBLOCK);

            // Cross platform stdlib read
            size_t read = 0;
            do {
                read = fread(data + readBytes, 1, size_t(len - readBytes), fh);
            } while (read == 0 && !feof(fh) && errno == EINTR);
            if (read > 0) {
                readBytes += read;
                break;
            } else {
                if (readBytes)
                    break;
                readBytes = read;
            }

            // Unix: Restore the blocking state of the underlying socket
            if ((oldFlags & O_NONBLOCK) == 0) {
                fcntl(QT_FILENO(fh), F_SETFL, oldFlags);
                if (readBytes == 0) {
                    int readByte = 0;
                    do {
                        readByte = fgetc(fh);
                    } while (readByte == -1 && errno == EINTR);
                    if (readByte != -1) {
                        *data = uchar(readByte);
                        readBytes += 1;
                    } else {
                        break;
                    }
                }
            }
        }
        // Unix: Restore the blocking state of the underlying socket
        if ((oldFlags & O_NONBLOCK) == 0) {
            fcntl(QT_FILENO(fh), F_SETFL, oldFlags);
        }
        if (readBytes == 0 && !feof(fh)) {
            // if we didn't read anything and we're not at EOF, it must be an error
            q->setError(QFile::ReadError, qt_error_string(errno));
            return -1;
        }
        return readBytes;
    }

    return readFdFh(data, len);
}